

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astar.cpp
# Opt level: O1

vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> * __thiscall
astar::astar_path(vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                  *__return_storage_ptr__,astar *this,
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *map)

{
  pointer *pppVar1;
  iterator iVar2;
  pointer ppVar3;
  double dVar4;
  bool bVar5;
  bool bVar6;
  int p;
  int iVar7;
  ulong uVar8;
  uint y;
  int iVar9;
  uint k;
  pointer piVar10;
  uint x;
  long lVar11;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  undefined1 local_168 [8];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  open;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  visited;
  priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_> temp_list;
  undefined1 local_110 [8];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  parentDir;
  vector<int,_std::allocator<int>_> moveX;
  vector<int,_std::allocator<int>_> moveY;
  undefined1 auStack_b8 [8];
  priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_> open_list;
  nodes child;
  undefined1 auStack_78 [8];
  nodes current;
  undefined1 auStack_58 [8];
  nodes start;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  open_list.c.super__Vector_base<nodes,_std::allocator<nodes>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  auStack_b8 = (undefined1  [8])0x0;
  open_list.c.super__Vector_base<nodes,_std::allocator<nodes>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  visited.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  start.g_cost_ = 0.0;
  auStack_58 = (undefined1  [8])0x0;
  start.x_ = 0;
  start.y_ = 0;
  auStack_58 = (undefined1  [8])operator_new(0xc80);
  piVar10 = (pointer)((long)auStack_58 + 0xc80);
  start._0_8_ = auStack_58;
  start.g_cost_ = (double)piVar10;
  memset((void *)auStack_58,0,0xc80);
  start._0_8_ = piVar10;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)local_168,800,(value_type *)auStack_58,
           (allocator_type *)
           &open.
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (auStack_58 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_58,(long)start.g_cost_ - (long)auStack_58);
  }
  auStack_58 = (undefined1  [8])0x0;
  start.x_ = 0;
  start.y_ = 0;
  start.g_cost_ = 0.0;
  auStack_58 = (undefined1  [8])operator_new(0xc80);
  piVar10 = (pointer)((long)auStack_58 + 0xc80);
  start._0_8_ = auStack_58;
  start.g_cost_ = (double)piVar10;
  memset((void *)auStack_58,0,0xc80);
  start._0_8_ = piVar10;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)&open.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,800,(value_type *)auStack_58,
           (allocator_type *)local_110);
  if (auStack_58 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_58,(long)start.g_cost_ - (long)auStack_58);
  }
  auStack_58 = (undefined1  [8])0x0;
  start.x_ = 0;
  start.y_ = 0;
  start.g_cost_ = 0.0;
  auStack_58 = (undefined1  [8])operator_new(0xc80);
  piVar10 = (pointer)((long)auStack_58 + 0xc80);
  start._0_8_ = auStack_58;
  start.g_cost_ = (double)piVar10;
  memset((void *)auStack_58,0,0xc80);
  start._0_8_ = piVar10;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)local_110,800,(value_type *)auStack_58,
           (allocator_type *)
           &parentDir.
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (auStack_58 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_58,(long)start.g_cost_ - (long)auStack_58);
  }
  start.g_cost_ = -NAN;
  start.f_cost_ = 2.12199579096527e-314;
  auStack_58 = (undefined1  [8])0x100000001;
  start.x_ = 0;
  start.y_ = -1;
  __l._M_len = 8;
  __l._M_array = (iterator)auStack_58;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &parentDir.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,__l,
             (allocator_type *)
             &moveX.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  start.g_cost_ = -NAN;
  start.f_cost_ = -NAN;
  auStack_58 = (undefined1  [8])0x100000000;
  start.x_ = 1;
  start.y_ = 1;
  __l_00._M_len = 8;
  __l_00._M_array = (iterator)auStack_58;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &moveX.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,__l_00,(allocator_type *)auStack_78);
  nodes::nodes((nodes *)auStack_58,this->x_start_,this->y_start_,0.0,0.0);
  start.g_cost_ = nodes::compute_f((nodes *)auStack_58,this->x_goal_,this->y_goal_);
  std::priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>::push
            ((priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
              *)auStack_b8,(value_type *)auStack_58);
  (((pointer)((long)local_168 + (long)(int)auStack_58._0_4_ * 0x18))->
  super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
  [(int)auStack_58._4_4_] = (int)start.g_cost_;
  bVar6 = false;
  do {
    if (auStack_b8 ==
        (undefined1  [8])
        open_list.c.super__Vector_base<nodes,_std::allocator<nodes>_>._M_impl.
        super__Vector_impl_data._M_start) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Path not found.",0xf);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
      std::ostream::put(-0x50);
      std::ostream::flush();
      auStack_78._0_4_ = -1;
      auStack_78._4_4_ = -1;
      iVar2._M_current =
           (__return_storage_ptr__->
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
        _M_realloc_insert<std::pair<int,int>>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                   __return_storage_ptr__,iVar2,(pair<int,_int> *)auStack_78);
      }
      else {
        (iVar2._M_current)->first = -1;
        (iVar2._M_current)->second = -1;
        pppVar1 = &(__return_storage_ptr__->
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *pppVar1 = *pppVar1 + 1;
      }
      bVar6 = true;
      break;
    }
    current.g_cost_ = *(double *)((long)auStack_b8 + 0x10);
    auStack_78 = *(undefined1 (*) [8])auStack_b8;
    current._0_8_ = *(double *)((long)auStack_b8 + 8);
    std::priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>::
    pop((priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_> *)
        auStack_b8);
    (((pointer)((long)local_168 + (long)(int)auStack_78._0_4_ * 0x18))->
    super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
    [(int)auStack_78._4_4_] = 0;
    open.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage[(int)auStack_78._0_4_].
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [(int)auStack_78._4_4_] = 1;
    if ((auStack_78._0_4_ == this->x_goal_) && (auStack_78._4_4_ == this->y_goal_)) {
      bVar6 = true;
      iVar7 = auStack_78._0_4_;
      for (iVar9 = auStack_78._4_4_; (iVar7 != this->x_start_ || (iVar9 != this->y_start_));
          iVar9 = iVar9 + moveX.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage[lVar11]) {
        lVar11 = (long)(((pointer)((long)local_110 + (long)iVar7 * 0x18))->
                       super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start[iVar9];
        open_list._28_4_ = iVar9;
        open_list._24_4_ = iVar7;
        iVar2._M_current =
             (__return_storage_ptr__->
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl
             .super__Vector_impl_data._M_finish;
        if (iVar2._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
          _M_realloc_insert<std::pair<int,int>>
                    ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                     __return_storage_ptr__,iVar2,(pair<int,_int> *)&open_list.field_0x18);
        }
        else {
          *iVar2._M_current = (pair<int,_int>)open_list._24_8_;
          pppVar1 = &(__return_storage_ptr__->
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)
                     ._M_impl.super__Vector_impl_data._M_finish;
          *pppVar1 = *pppVar1 + 1;
        }
        iVar7 = iVar7 + *(int *)((long)&((parentDir.
                                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                        super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                        super__Vector_impl_data._M_start + lVar11 * 4);
      }
      bVar5 = false;
    }
    else {
      lVar11 = 0;
      do {
        x = *(int *)((long)&((parentDir.
                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                            super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start + lVar11 * 4) + auStack_78._0_4_;
        if (x < 800) {
          y = moveX.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage[lVar11] + auStack_78._4_4_;
          if (y < 800) {
            uVar8 = (ulong)y;
            if ((*(int *)(*(long *)&(map->
                                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start[x].
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data + uVar8 * 4) != 0) &&
               (open.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage[x].
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start[uVar8] != 1)) {
              nodes::nodes((nodes *)&open_list.field_0x18,x,y,(double)current._0_8_,current.g_cost_)
              ;
              k = (uint)lVar11;
              nodes::compute_g((nodes *)&open_list.field_0x18,k);
              dVar4 = nodes::compute_f((nodes *)&open_list.field_0x18,this->x_goal_,this->y_goal_);
              piVar10 = (((pointer)((long)local_168 + (ulong)x * 0x18))->
                        super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              if (piVar10[uVar8] == 0) {
                piVar10[uVar8] = (int)dVar4;
                std::
                priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                ::push((priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                        *)auStack_b8,(value_type *)&open_list.field_0x18);
                (((pointer)((long)local_110 + (ulong)x * 0x18))->
                super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                _M_start[uVar8] = k ^ 4;
              }
              else if (dVar4 < (double)piVar10[uVar8]) {
                piVar10[uVar8] = (int)dVar4;
                (((pointer)((long)local_110 + (ulong)x * 0x18))->
                super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                _M_start[uVar8] = k ^ 4;
                while ((*(int *)auStack_b8 != x || (*(int *)((long)auStack_b8 + 4) != y))) {
                  std::
                  priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                  ::push((priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                          *)&visited.
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (value_type *)auStack_b8);
                  std::
                  priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                  ::pop((priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                         *)auStack_b8);
                }
                std::
                priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                ::pop((priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                       *)auStack_b8);
                while (visited.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
                  std::
                  priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                  ::push((priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                          *)auStack_b8,
                         (value_type *)
                         visited.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  std::
                  priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                  ::pop((priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                         *)&visited.
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
                }
                std::
                priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                ::push((priority_queue<nodes,_std::vector<nodes,_std::allocator<nodes>_>,_std::greater<nodes>_>
                        *)auStack_b8,(value_type *)&open_list.field_0x18);
              }
              nodes::~nodes((nodes *)&open_list.field_0x18);
            }
          }
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != 8);
      bVar5 = true;
    }
    nodes::~nodes((nodes *)auStack_78);
  } while (bVar5);
  nodes::~nodes((nodes *)auStack_58);
  if (moveX.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage != (pointer)0x0) {
    operator_delete(moveX.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    (long)moveY.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)moveX.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  }
  if (parentDir.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(parentDir.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    (long)moveX.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)parentDir.
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)local_110);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)&open.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)local_168);
  std::vector<nodes,_std::allocator<nodes>_>::~vector
            ((vector<nodes,_std::allocator<nodes>_> *)
             &visited.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<nodes,_std::allocator<nodes>_>::~vector
            ((vector<nodes,_std::allocator<nodes>_> *)auStack_b8);
  if ((!bVar6) &&
     (ppVar3 = (__return_storage_ptr__->
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
               _M_impl.super__Vector_impl_data._M_start, ppVar3 != (pointer)0x0)) {
    operator_delete(ppVar3,(long)(__return_storage_ptr__->
                                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                 )._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVar3)
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<int, int>> astar::astar_path(
                                std::vector<std::vector<int>> map) {
    int neighbours = 8;  // max no of possible neighbors for any node

    std::vector<std::pair<int, int>> path;
    // Create a priority list of open nodes
    std::priority_queue<nodes, std::vector<nodes>,
                        std::greater<nodes>> open_list;
    // Create a priority list to store temporary nodes
    std::priority_queue<nodes, std::vector<nodes>,
                          std::greater<nodes>> temp_list;
    // Create 2D vectors to store open and visited nodes.
    std::vector<std::vector<int> > open(800, std::vector<int>(800, 0));
    std::vector<std::vector<int> > visited(800, std::vector<int>(800, 0));
    std::vector<std::vector<int> > parentDir(800, std::vector<int>(800, 0));

    // 8 possible moves in x and y direction
    std::vector<int> moveX { 1, 1, 0, -1, -1, -1, 0, 1 };
    std::vector<int> moveY { 0, 1, 1, 1, 0, -1, -1, -1 };

    nodes start(x_start_, y_start_, 0, 0);
    start.f_cost_ = start.compute_f(x_goal_, y_goal_);
    open_list.push(start);
    open[start.x_][start.y_] = start.f_cost_;

    /**This loop takes the first entry of the open list as the current node
     * since it has the lowest total cost function.*/

    while (!open_list.empty()) {
      nodes current = open_list.top();
      open_list.pop();
      open[current.x_][current.y_] = 0;
      visited[current.x_][current.y_] = 1;

      /** Trace the path and store it of the goal is found.*/

      if (current.x_ == x_goal_ && current.y_ == y_goal_) {
        int p = current.x_, q = current.y_;
        while (!(p == x_start_ && q == y_start_)) {
          int j = parentDir[p][q];
          path.push_back(std::make_pair(p, q));
          p += moveX[j];
          q += moveY[j];
        }
        return path;
      }

      /** Expand all the nodes for current node, calculate their 
       * costs and store them in their variables.*/
      int dir = 0;
      while (dir < 8) {
          int dx = current.x_ + moveX[dir], dy = current.y_ + moveY[dir];
          /** For all the nodes lying outside the map, blocked
           * or is in the visisted list then simply ignor them.*/
        if (!(dx < 0 || dx > 799 || dy < 0 || dy > 799 ||
              map[dx][dy] == 0 || visited[dx][dy] == 1)) {
            nodes child(dx, dy, current.g_cost_, current.f_cost_);
            child.g_cost_ = child.compute_g(dir);
            child.f_cost_ = child.compute_f(x_goal_, y_goal_);
            /* For new nodes, calculate their costs and store them.*/
          if (open[dx][dy] == 0) {
              open[dx][dy] = child.f_cost_;
              open_list.push(child);
              parentDir[dx][dy] = (dir + neighbours / 2) % neighbours;
            /* If the node exists in open list but has more
            * promising total cost then it is replaced by
            * the previous node and it's parent direction is updated.*/
            } else if (open[dx][dy] > child.f_cost_) {
              open[dx][dy] = child.f_cost_;
              parentDir[dx][dy] = (dir + 8 / 2) % 8;
            while (!(open_list.top().x_ == dx && open_list.top().y_ == dy)) {
              temp_list.push(open_list.top());
              open_list.pop();
            }
            open_list.pop();
            while (!temp_list.empty()) {
              open_list.push(temp_list.top());
              temp_list.pop();
            }
            open_list.push(child);
          }
        }
        ++dir;
      }
    }
    std::cout << "Path not found."
              << std::endl;
    path.push_back(std::make_pair(-1, -1));
    return path;
}